

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printObject(JSPrinter *this,Ref node)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_t *psVar5;
  Value *pVVar6;
  size_t sVar7;
  Ref *pRVar8;
  ulong uVar9;
  undefined8 *puVar10;
  char *local_50;
  char *check;
  char *str;
  char *setterParam;
  char *getterSetter;
  ulong uStack_28;
  bool needQuote;
  size_t i;
  Ref args;
  JSPrinter *this_local;
  Ref node_local;
  
  args.inst = (Value *)this;
  this_local = (JSPrinter *)node.inst;
  emit(this,'{');
  this->indent = this->indent + 1;
  newline(this);
  psVar5 = (size_t *)cashew::Ref::operator[]((uint)&this_local);
  i = *psVar5;
  uStack_28 = 0;
  do {
    pVVar6 = Ref::operator->((Ref *)&i);
    sVar7 = Value::size(pVVar6);
    if (sVar7 <= uStack_28) {
      this->indent = this->indent + -1;
      newline(this);
      emit(this,'}');
      return;
    }
    if (uStack_28 != 0) {
      if ((this->pretty & 1U) == 0) {
        emit(this,',');
      }
      else {
        emit(this,", ");
      }
      newline(this);
    }
    bVar1 = false;
    setterParam = (char *)0x0;
    str = (char *)0x0;
    uVar3 = cashew::Ref::operator[]((uint)&i);
    pRVar8 = (Ref *)cashew::Ref::operator[](uVar3);
    pVVar6 = Ref::operator->(pRVar8);
    bVar2 = Value::isArray(pVVar6);
    if (bVar2) {
      uVar3 = cashew::Ref::operator[]((uint)&i);
      uVar3 = cashew::Ref::operator[](uVar3);
      pRVar8 = (Ref *)cashew::Ref::operator[](uVar3);
      uVar9 = cashew::Ref::operator==(pRVar8,(IString *)&STRING);
      if ((uVar9 & 1) == 0) {
        uVar3 = cashew::Ref::operator[]((uint)&i);
        uVar3 = cashew::Ref::operator[](uVar3);
        pRVar8 = (Ref *)cashew::Ref::operator[](uVar3);
        uVar9 = cashew::Ref::operator==(pRVar8,(IString *)&GETTER);
        if ((uVar9 & 1) == 0) {
          uVar3 = cashew::Ref::operator[]((uint)&i);
          uVar3 = cashew::Ref::operator[](uVar3);
          pRVar8 = (Ref *)cashew::Ref::operator[](uVar3);
          uVar9 = cashew::Ref::operator==(pRVar8,(IString *)&SETTER);
          if ((uVar9 & 1) == 0) {
            abort();
          }
          setterParam = std::basic_string_view<char,_std::char_traits<char>_>::data
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&SETTER);
          uVar3 = cashew::Ref::operator[]((uint)&i);
          uVar3 = cashew::Ref::operator[](uVar3);
          pRVar8 = (Ref *)cashew::Ref::operator[](uVar3);
          pVVar6 = Ref::operator->(pRVar8);
          check = Value::getCString(pVVar6);
          uVar3 = cashew::Ref::operator[]((uint)&i);
          uVar3 = cashew::Ref::operator[](uVar3);
          pRVar8 = (Ref *)cashew::Ref::operator[](uVar3);
          pVVar6 = Ref::operator->(pRVar8);
          str = Value::getCString(pVVar6);
        }
        else {
          setterParam = std::basic_string_view<char,_std::char_traits<char>_>::data
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&GETTER);
          uVar3 = cashew::Ref::operator[]((uint)&i);
          uVar3 = cashew::Ref::operator[](uVar3);
          pRVar8 = (Ref *)cashew::Ref::operator[](uVar3);
          pVVar6 = Ref::operator->(pRVar8);
          check = Value::getCString(pVVar6);
        }
      }
      else {
        bVar1 = true;
        uVar3 = cashew::Ref::operator[]((uint)&i);
        uVar3 = cashew::Ref::operator[](uVar3);
        pRVar8 = (Ref *)cashew::Ref::operator[](uVar3);
        pVVar6 = Ref::operator->(pRVar8);
        check = Value::getCString(pVVar6);
      }
    }
    else {
      uVar3 = cashew::Ref::operator[]((uint)&i);
      pRVar8 = (Ref *)cashew::Ref::operator[](uVar3);
      pVVar6 = Ref::operator->(pRVar8);
      check = Value::getCString(pVVar6);
    }
    for (local_50 = check; *local_50 != '\0'; local_50 = local_50 + 1) {
      iVar4 = isalnum((int)*local_50);
      if (((iVar4 == 0) && (*local_50 != '_')) && (*local_50 != '$')) {
        bVar1 = true;
        break;
      }
    }
    if (setterParam != (char *)0x0) {
      emit(this,setterParam);
      space(this);
    }
    if (bVar1) {
      emit(this,'\"');
    }
    emit(this,check);
    if (bVar1) {
      emit(this,'\"');
    }
    if (setterParam == (char *)0x0) {
      emit(this,":");
    }
    else {
      emit(this,'(');
      if (str != (char *)0x0) {
        emit(this,str);
      }
      emit(this,')');
    }
    space(this);
    uVar3 = cashew::Ref::operator[]((uint)&i);
    puVar10 = (undefined8 *)cashew::Ref::operator[](uVar3);
    print(this,(Value *)*puVar10);
    uStack_28 = uStack_28 + 1;
  } while( true );
}

Assistant:

void printObject(Ref node) {
    emit('{');
    indent++;
    newline();
    Ref args = node[1];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        pretty ? emit(", ") : emit(',');
        newline();
      }
      bool needQuote = false;
      const char* getterSetter = nullptr;
      const char* setterParam = nullptr;
      const char* str;
      if (args[i][0]->isArray()) {
        if (args[i][0][0] == STRING) {
          // A quoted string.
          needQuote = true;
          str = args[i][0][1]->getCString();
        } else if (args[i][0][0] == GETTER) {
          getterSetter = GETTER.str.data();
          str = args[i][0][1]->getCString();
        } else if (args[i][0][0] == SETTER) {
          getterSetter = SETTER.str.data();
          str = args[i][0][1]->getCString();
          setterParam = args[i][0][2]->getCString();
        } else {
          abort();
        }
      } else {
        // Just a raw string, no quotes.
        str = args[i][0]->getCString();
      }
      const char* check = str;
      while (*check) {
        if (!isalnum(*check) && *check != '_' && *check != '$') {
          needQuote = true;
          break;
        }
        check++;
      }
      if (getterSetter != nullptr) {
        emit(getterSetter);
        space();
      }
      if (needQuote) {
        emit('"');
      }
      emit(str);
      if (needQuote) {
        emit('"');
      }
      if (getterSetter != nullptr) {
        emit('(');
        if (setterParam != nullptr) {
          emit(setterParam);
        }
        emit(')');
      } else {
        emit(":");
      }
      space();
      print(args[i][1]);
    }
    indent--;
    newline();
    emit('}');
  }